

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

double GetUDMFFloat(int type,int index,char *key)

{
  FUDMFKey *pFVar1;
  bool local_35;
  FName local_34 [3];
  FUDMFKey *pKey;
  FUDMFKeys *pKeys;
  char *key_local;
  int index_local;
  int type_local;
  
  local_35 = 3 < (uint)type;
  pKeys = (FUDMFKeys *)key;
  key_local._0_4_ = index;
  key_local._4_4_ = type;
  if (local_35) {
    __assert_fail("type >=0 && type <=3",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                  ,0x166,"double GetUDMFFloat(int, int, const char *)");
  }
  pFVar1 = (FUDMFKey *)
           TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::CheckKey
                     (UDMFKeys + type,index);
  if (pFVar1 != (FUDMFKey *)0x0) {
    pKey = pFVar1;
    FName::FName(local_34,(char *)pKeys);
    pFVar1 = FUDMFKeys::Find((FUDMFKeys *)pFVar1,local_34);
    if (pFVar1 != (FUDMFKey *)0x0) {
      return pFVar1->FloatVal;
    }
  }
  return 0.0;
}

Assistant:

double GetUDMFFloat(int type, int index, const char *key)
{
	assert(type >=0 && type <=3);

	FUDMFKeys *pKeys = UDMFKeys[type].CheckKey(index);

	if (pKeys != NULL)
	{
		FUDMFKey *pKey = pKeys->Find(key);
		if (pKey != NULL)
		{
			return pKey->FloatVal;
		}
	}
	return 0;
}